

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::local_context::local_context
          (local_context *this,context *ctx,uint thread_id_,result_type_conflict seed)

{
  result_type_conflict seed_local;
  uint thread_id__local;
  context *ctx_local;
  local_context *this_local;
  
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&this->rng,seed);
  std::normal_distribution<double>::normal_distribution
            (&this->choose_sol_dist,(ctx->parameters).init_crossover_solution_selection_mean,
             (ctx->parameters).init_crossover_solution_selection_stddev);
  std::normal_distribution<double>::normal_distribution
            (&this->variable_p_dist,(ctx->parameters).init_mutation_variable_mean,
             (ctx->parameters).init_mutation_variable_stddev);
  std::normal_distribution<double>::normal_distribution
            (&this->value_p_dist,(ctx->parameters).init_mutation_value_mean,
             (ctx->parameters).init_mutation_value_stddev);
  std::uniform_int_distribution<int>::uniform_int_distribution
            (&this->bad_solution_choose,(ctx->parameters).init_population_size / 5,
             (ctx->parameters).init_population_size + -1);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            (&this->crossover_dist,0,0xffffffffffffffff);
  std::bernoulli_distribution::bernoulli_distribution
            (&this->crossover_bastert_insertion,(ctx->parameters).init_crossover_bastert_insertion);
  this->init_kappa_improve_start = (ctx->parameters).init_kappa_improve_start;
  this->init_kappa_improve_increase = (ctx->parameters).init_kappa_improve_increase;
  this->init_kappa_improve_stop = (ctx->parameters).init_kappa_improve_stop;
  this->thread_id = thread_id_;
  return;
}

Assistant:

local_context(const context& ctx,
                  const unsigned thread_id_,
                  const random_engine::result_type seed)
      : rng(seed)
      , choose_sol_dist(
          ctx.parameters.init_crossover_solution_selection_mean,
          ctx.parameters.init_crossover_solution_selection_stddev)
      , variable_p_dist(ctx.parameters.init_mutation_variable_mean,
                        ctx.parameters.init_mutation_variable_stddev)
      , value_p_dist(ctx.parameters.init_mutation_value_mean,
                     ctx.parameters.init_mutation_value_stddev)
      , bad_solution_choose(ctx.parameters.init_population_size / 5,
                            ctx.parameters.init_population_size - 1)
      , crossover_dist(0)
      , crossover_bastert_insertion(
          ctx.parameters.init_crossover_bastert_insertion)
      , init_kappa_improve_start(ctx.parameters.init_kappa_improve_start)
      , init_kappa_improve_increase(ctx.parameters.init_kappa_improve_increase)
      , init_kappa_improve_stop(ctx.parameters.init_kappa_improve_stop)
      , thread_id(thread_id_)
    {}